

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O3

Vec_Wec_t * Gia_ManLevelizeR(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Vec_Wec_t *pVVar5;
  Gia_Obj_t *pObj;
  long lVar6;
  int iVar7;
  long lVar8;
  int local_5c;
  Vec_Int_t *local_58;
  
  uVar2 = Gia_ManLevelRNum(p);
  iVar7 = uVar2 + 1;
  pVVar5 = (Vec_Wec_t *)malloc(0x10);
  local_5c = 8;
  if (6 < uVar2) {
    local_5c = iVar7;
  }
  pVVar5->nCap = local_5c;
  if (local_5c == 0) {
    local_58 = (Vec_Int_t *)0x0;
  }
  else {
    local_58 = (Vec_Int_t *)calloc((long)local_5c,0x10);
  }
  pVVar5->pArray = local_58;
  pVVar5->nSize = iVar7;
  if (0 < p->nObjs) {
    lVar8 = 0;
    lVar6 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return pVVar5;
      }
      if ((lVar6 != 0) &&
         ((pObj = (Gia_Obj_t *)(&p->pObjs->field_0x0 + lVar8),
          (int)*(uint *)pObj < 0 && (~*(uint *)pObj & 0x1fffffff) != 0 ||
          (iVar3 = Gia_ObjLevel(p,pObj), iVar3 != 0)))) {
        uVar4 = Gia_ObjLevel(p,pObj);
        if ((int)uVar2 < (int)uVar4) {
          __assert_fail("Level <= nLevels",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDfs.c"
                        ,0x1ba,"Vec_Wec_t *Gia_ManLevelizeR(Gia_Man_t *)");
        }
        if (iVar7 <= (int)uVar4) {
          iVar3 = uVar4 + 1;
          iVar1 = iVar7 * 2;
          if (iVar7 * 2 <= iVar3) {
            iVar1 = iVar3;
          }
          if (iVar1 - local_5c != 0 && local_5c <= iVar1) {
            if (local_58 == (Vec_Int_t *)0x0) {
              local_58 = (Vec_Int_t *)malloc((long)iVar1 << 4);
            }
            else {
              local_58 = (Vec_Int_t *)realloc(local_58,(long)iVar1 << 4);
            }
            pVVar5->pArray = local_58;
            memset(local_58 + local_5c,0,(long)(iVar1 - local_5c) << 4);
            pVVar5->nCap = iVar1;
            local_5c = iVar1;
          }
          pVVar5->nSize = iVar3;
          iVar7 = iVar3;
        }
        if (((int)uVar4 < 0) || (iVar7 <= (int)uVar4)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        Vec_IntPush(local_58 + uVar4,(int)lVar6);
      }
      lVar6 = lVar6 + 1;
      lVar8 = lVar8 + 0xc;
    } while (lVar6 < p->nObjs);
  }
  return pVVar5;
}

Assistant:

Vec_Wec_t * Gia_ManLevelizeR( Gia_Man_t * p )
{ 
    Gia_Obj_t * pObj;
    Vec_Wec_t * vLevels;
    int nLevels, Level, i;
    nLevels = Gia_ManLevelRNum( p );
    vLevels = Vec_WecStart( nLevels + 1 );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( i == 0 || (!Gia_ObjIsCo(pObj) && !Gia_ObjLevel(p, pObj)) )
            continue;
        Level = Gia_ObjLevel( p, pObj );
        assert( Level <= nLevels );
        Vec_WecPush( vLevels, Level, i );
    }
    return vLevels;
}